

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O3

optional<svg::Point> *
svg::getMaxPoint(optional<svg::Point> *__return_storage_ptr__,
                vector<svg::Point,_std::allocator<svg::Point>_> *points)

{
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  Point PVar6;
  
  pPVar2 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (points->super__Vector_base<svg::Point,_std::allocator<svg::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar2 != pPVar1) {
    lVar3 = (long)pPVar1 - (long)pPVar2;
    PVar6 = *pPVar2;
    uVar4 = 1;
    do {
      PVar6 = (Point)maxpd((undefined1  [16])*pPVar2,(undefined1  [16])PVar6);
      uVar5 = (ulong)uVar4;
      pPVar2 = pPVar2 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 4));
    __return_storage_ptr__->valid = true;
    __return_storage_ptr__->type = PVar6;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->valid = false;
  (__return_storage_ptr__->type).x = 0.0;
  (__return_storage_ptr__->type).y = 0.0;
  return __return_storage_ptr__;
}

Assistant:

optional<Point> getMaxPoint(std::vector<Point> const & points)
    {
        if (points.empty())
            return optional<Point>();

        Point max = points[0];
        for (unsigned i = 0; i < points.size(); ++i) {
            if (points[i].x > max.x)
                max.x = points[i].x;
            if (points[i].y > max.y)
                max.y = points[i].y;
        }
        return optional<Point>(max);
    }